

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_setup_create(Curl_cfilter **pcf,Curl_easy *data,Curl_dns_entry *remotehost,int transport
                        ,int ssl_mode)

{
  cf_setup_ctx *local_48;
  CURLcode local_3c;
  undefined4 *puStack_38;
  CURLcode result;
  cf_setup_ctx *ctx;
  Curl_cfilter *cf;
  int ssl_mode_local;
  int transport_local;
  Curl_dns_entry *remotehost_local;
  Curl_easy *data_local;
  Curl_cfilter **pcf_local;
  
  ctx = (cf_setup_ctx *)0x0;
  cf._0_4_ = ssl_mode;
  cf._4_4_ = transport;
  _ssl_mode_local = remotehost;
  remotehost_local = (Curl_dns_entry *)data;
  data_local = (Curl_easy *)pcf;
  puStack_38 = (undefined4 *)(*Curl_ccalloc)(1,0x18);
  if (puStack_38 == (undefined4 *)0x0) {
    local_3c = CURLE_OUT_OF_MEMORY;
  }
  else {
    *puStack_38 = 0;
    *(Curl_dns_entry **)(puStack_38 + 2) = _ssl_mode_local;
    puStack_38[4] = (int)cf;
    puStack_38[5] = cf._4_4_;
    local_3c = Curl_cf_create((Curl_cfilter **)&ctx,&Curl_cft_setup,puStack_38);
    if (local_3c == CURLE_OK) {
      puStack_38 = (undefined4 *)0x0;
    }
  }
  if (local_3c == CURLE_OK) {
    local_48 = ctx;
  }
  else {
    local_48 = (cf_setup_ctx *)0x0;
  }
  *(cf_setup_ctx **)data_local = local_48;
  (*Curl_cfree)(puStack_38);
  return local_3c;
}

Assistant:

static CURLcode cf_setup_create(struct Curl_cfilter **pcf,
                                struct Curl_easy *data,
                                const struct Curl_dns_entry *remotehost,
                                int transport,
                                int ssl_mode)
{
  struct Curl_cfilter *cf = NULL;
  struct cf_setup_ctx *ctx;
  CURLcode result = CURLE_OK;

  (void)data;
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }
  ctx->state = CF_SETUP_INIT;
  ctx->remotehost = remotehost;
  ctx->ssl_mode = ssl_mode;
  ctx->transport = transport;

  result = Curl_cf_create(&cf, &Curl_cft_setup, ctx);
  if(result)
    goto out;
  ctx = NULL;

out:
  *pcf = result ? NULL : cf;
  free(ctx);
  return result;
}